

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersector1<4,_16777232,_false,_embree::sse42::ArrayIntersector1<embree::sse42::InstanceArrayIntersector1MB>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  float fVar8;
  Primitive *prim;
  bool bVar9;
  AABBNodeMB4D *node1;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  Precalculations pre;
  NodeRef stack [244];
  Precalculations local_881;
  ulong *local_880;
  Ray *local_878;
  RayQueryContext *local_870;
  Primitive *local_868;
  long local_860;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  ulong local_7d8 [245];
  
  local_7d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if ((local_7d8[0] != 8) && (fVar27 = ray->tfar, 0.0 <= fVar27)) {
    local_880 = local_7d8 + 1;
    fVar45 = (ray->org).field_0.m128[0];
    fVar49 = (ray->org).field_0.m128[1];
    fVar31 = (ray->org).field_0.m128[2];
    fVar28 = *(float *)((long)&(ray->org).field_0 + 0xc);
    aVar3 = (ray->dir).field_0.field_1;
    fVar35 = 0.0;
    if (0.0 <= fVar28) {
      fVar35 = fVar28;
    }
    auVar17._4_4_ = -(uint)(ABS(aVar3.y) < DAT_01f4bd50._4_4_);
    auVar17._0_4_ = -(uint)(ABS(aVar3.x) < (float)DAT_01f4bd50);
    auVar17._8_4_ = -(uint)(ABS(aVar3.z) < DAT_01f4bd50._8_4_);
    auVar17._12_4_ = -(uint)(ABS(aVar3.field_3.w) < DAT_01f4bd50._12_4_);
    auVar19 = blendvps((undefined1  [16])aVar3,_DAT_01f4bd50,auVar17);
    auVar17 = rcpps(auVar17,auVar19);
    fVar39 = auVar17._0_4_;
    fVar40 = auVar17._4_4_;
    fVar42 = auVar17._8_4_;
    fVar39 = (1.0 - auVar19._0_4_ * fVar39) * fVar39 + fVar39;
    fVar40 = (1.0 - auVar19._4_4_ * fVar40) * fVar40 + fVar40;
    fVar42 = (1.0 - auVar19._8_4_ * fVar42) * fVar42 + fVar42;
    uVar15 = (ulong)(fVar39 < 0.0) * 0x10;
    uVar16 = (ulong)(fVar40 < 0.0) << 4 | 0x20;
    uVar14 = (ulong)(fVar42 < 0.0) << 4 | 0x40;
    fStack_7dc = fVar27;
    fVar28 = fVar27;
    fVar29 = fVar27;
    fVar30 = fVar27;
    fVar32 = fVar31;
    fVar33 = fVar31;
    fVar34 = fVar31;
    fVar36 = fVar35;
    fVar37 = fVar35;
    fVar38 = fVar35;
    fVar41 = fVar42;
    fVar43 = fVar42;
    fVar44 = fVar42;
    fVar46 = fVar45;
    fVar47 = fVar45;
    fVar48 = fVar45;
    fVar50 = fVar49;
    fVar51 = fVar49;
    fVar52 = fVar49;
    fVar53 = fVar39;
    fVar54 = fVar39;
    fVar55 = fVar39;
    fVar56 = fVar40;
    fVar57 = fVar40;
    fVar58 = fVar40;
    local_878 = ray;
    local_870 = context;
    local_858 = fVar40;
    fStack_854 = fVar40;
    fStack_850 = fVar40;
    fStack_84c = fVar40;
    local_848 = fVar39;
    fStack_844 = fVar39;
    fStack_840 = fVar39;
    fStack_83c = fVar39;
    local_838 = fVar49;
    fStack_834 = fVar49;
    fStack_830 = fVar49;
    fStack_82c = fVar49;
    local_828 = fVar45;
    fStack_824 = fVar45;
    fStack_820 = fVar45;
    fStack_81c = fVar45;
    local_818 = fVar42;
    fStack_814 = fVar42;
    fStack_810 = fVar42;
    fStack_80c = fVar42;
    local_808 = fVar35;
    fStack_804 = fVar35;
    fStack_800 = fVar35;
    fStack_7fc = fVar35;
    local_7f8 = fVar31;
    fStack_7f4 = fVar31;
    fStack_7f0 = fVar31;
    fStack_7ec = fVar31;
    local_7e8 = fVar27;
    fStack_7e4 = fVar27;
    fStack_7e0 = fVar27;
LAB_006aac15:
    if (local_880 != local_7d8) {
      uVar12 = local_880[-1];
      local_880 = local_880 + -1;
LAB_006aac33:
      fVar8 = (ray->dir).field_0.m128[3];
      while ((uVar12 & 8) == 0) {
        uVar10 = uVar12 & 0xfffffffffffffff0;
        pfVar2 = (float *)(uVar10 + 0x80 + uVar15);
        pfVar1 = (float *)(uVar10 + 0x20 + uVar15);
        auVar20._0_4_ = ((*pfVar2 * fVar8 + *pfVar1) - fVar45) * fVar39;
        auVar20._4_4_ = ((pfVar2[1] * fVar8 + pfVar1[1]) - fVar46) * fVar53;
        auVar20._8_4_ = ((pfVar2[2] * fVar8 + pfVar1[2]) - fVar47) * fVar54;
        auVar20._12_4_ = ((pfVar2[3] * fVar8 + pfVar1[3]) - fVar48) * fVar55;
        auVar23._4_4_ = fVar36;
        auVar23._0_4_ = fVar35;
        auVar23._8_4_ = fVar37;
        auVar23._12_4_ = fVar38;
        auVar17 = maxps(auVar23,auVar20);
        pfVar2 = (float *)(uVar10 + 0x80 + uVar16);
        pfVar1 = (float *)(uVar10 + 0x20 + uVar16);
        auVar21._0_4_ = ((*pfVar2 * fVar8 + *pfVar1) - fVar49) * fVar40;
        auVar21._4_4_ = ((pfVar2[1] * fVar8 + pfVar1[1]) - fVar50) * fVar56;
        auVar21._8_4_ = ((pfVar2[2] * fVar8 + pfVar1[2]) - fVar51) * fVar57;
        auVar21._12_4_ = ((pfVar2[3] * fVar8 + pfVar1[3]) - fVar52) * fVar58;
        pfVar2 = (float *)(uVar10 + 0x80 + uVar14);
        pfVar1 = (float *)(uVar10 + 0x20 + uVar14);
        auVar24._0_4_ = ((*pfVar2 * fVar8 + *pfVar1) - fVar31) * fVar42;
        auVar24._4_4_ = ((pfVar2[1] * fVar8 + pfVar1[1]) - fVar32) * fVar41;
        auVar24._8_4_ = ((pfVar2[2] * fVar8 + pfVar1[2]) - fVar33) * fVar43;
        auVar24._12_4_ = ((pfVar2[3] * fVar8 + pfVar1[3]) - fVar34) * fVar44;
        auVar19 = maxps(auVar21,auVar24);
        auVar17 = maxps(auVar17,auVar19);
        pfVar2 = (float *)(uVar10 + 0x80 + (uVar15 ^ 0x10));
        pfVar1 = (float *)(uVar10 + 0x20 + (uVar15 ^ 0x10));
        auVar25._0_4_ = ((*pfVar2 * fVar8 + *pfVar1) - fVar45) * fVar39;
        auVar25._4_4_ = ((pfVar2[1] * fVar8 + pfVar1[1]) - fVar46) * fVar53;
        auVar25._8_4_ = ((pfVar2[2] * fVar8 + pfVar1[2]) - fVar47) * fVar54;
        auVar25._12_4_ = ((pfVar2[3] * fVar8 + pfVar1[3]) - fVar48) * fVar55;
        auVar22._4_4_ = fVar28;
        auVar22._0_4_ = fVar27;
        auVar22._8_4_ = fVar29;
        auVar22._12_4_ = fVar30;
        auVar23 = minps(auVar22,auVar25);
        pfVar2 = (float *)(uVar10 + 0x80 + (uVar16 ^ 0x10));
        pfVar1 = (float *)(uVar10 + 0x20 + (uVar16 ^ 0x10));
        auVar26._0_4_ = ((*pfVar2 * fVar8 + *pfVar1) - fVar49) * fVar40;
        auVar26._4_4_ = ((pfVar2[1] * fVar8 + pfVar1[1]) - fVar50) * fVar56;
        auVar26._8_4_ = ((pfVar2[2] * fVar8 + pfVar1[2]) - fVar51) * fVar57;
        auVar26._12_4_ = ((pfVar2[3] * fVar8 + pfVar1[3]) - fVar52) * fVar58;
        pfVar2 = (float *)(uVar10 + 0x80 + (uVar14 ^ 0x10));
        pfVar1 = (float *)(uVar10 + 0x20 + (uVar14 ^ 0x10));
        auVar19._4_4_ = ((pfVar2[1] * fVar8 + pfVar1[1]) - fVar32) * fVar41;
        auVar19._0_4_ = ((*pfVar2 * fVar8 + *pfVar1) - fVar31) * fVar42;
        auVar19._8_4_ = ((pfVar2[2] * fVar8 + pfVar1[2]) - fVar33) * fVar43;
        auVar19._12_4_ = ((pfVar2[3] * fVar8 + pfVar1[3]) - fVar34) * fVar44;
        auVar19 = minps(auVar26,auVar19);
        auVar19 = minps(auVar23,auVar19);
        uVar11 = (uint)uVar12 & 7;
        bVar9 = auVar17._0_4_ <= auVar19._0_4_;
        bVar5 = auVar17._4_4_ <= auVar19._4_4_;
        bVar6 = auVar17._8_4_ <= auVar19._8_4_;
        bVar7 = auVar17._12_4_ <= auVar19._12_4_;
        if (uVar11 == 6) {
          bVar9 = (fVar8 < *(float *)(uVar10 + 0xf0) && *(float *)(uVar10 + 0xe0) <= fVar8) && bVar9
          ;
          bVar5 = (fVar8 < *(float *)(uVar10 + 0xf4) && *(float *)(uVar10 + 0xe4) <= fVar8) && bVar5
          ;
          bVar6 = (fVar8 < *(float *)(uVar10 + 0xf8) && *(float *)(uVar10 + 0xe8) <= fVar8) && bVar6
          ;
          bVar7 = (fVar8 < *(float *)(uVar10 + 0xfc) && *(float *)(uVar10 + 0xec) <= fVar8) && bVar7
          ;
        }
        auVar18._0_4_ = (uint)bVar9 * -0x80000000;
        auVar18._4_4_ = (uint)bVar5 * -0x80000000;
        auVar18._8_4_ = (uint)bVar6 * -0x80000000;
        auVar18._12_4_ = (uint)bVar7 * -0x80000000;
        uVar11 = movmskps(uVar11,auVar18);
        if (uVar11 == 0) goto LAB_006aac15;
        uVar11 = uVar11 & 0xff;
        lVar4 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        uVar12 = *(ulong *)(uVar10 + lVar4 * 8);
        uVar11 = uVar11 - 1 & uVar11;
        uVar13 = (ulong)uVar11;
        if (uVar11 != 0) goto LAB_006aad60;
      }
      local_868 = (Primitive *)(uVar12 & 0xfffffffffffffff0);
      local_860 = (ulong)((uint)uVar12 & 0xf) - 7;
      while( true ) {
        local_860 = local_860 + -1;
        if (local_860 == 0) break;
        prim = local_868;
        local_868 = local_868 + 1;
        bVar9 = InstanceArrayIntersector1MB::occluded(&local_881,ray,local_870,prim);
        ray = local_878;
        fVar27 = local_7e8;
        fVar28 = fStack_7e4;
        fVar29 = fStack_7e0;
        fVar30 = fStack_7dc;
        fVar31 = local_7f8;
        fVar32 = fStack_7f4;
        fVar33 = fStack_7f0;
        fVar34 = fStack_7ec;
        fVar35 = local_808;
        fVar36 = fStack_804;
        fVar37 = fStack_800;
        fVar38 = fStack_7fc;
        fVar42 = local_818;
        fVar41 = fStack_814;
        fVar43 = fStack_810;
        fVar44 = fStack_80c;
        fVar45 = local_828;
        fVar46 = fStack_824;
        fVar47 = fStack_820;
        fVar48 = fStack_81c;
        fVar49 = local_838;
        fVar50 = fStack_834;
        fVar51 = fStack_830;
        fVar52 = fStack_82c;
        fVar39 = local_848;
        fVar53 = fStack_844;
        fVar54 = fStack_840;
        fVar55 = fStack_83c;
        fVar40 = local_858;
        fVar56 = fStack_854;
        fVar57 = fStack_850;
        fVar58 = fStack_84c;
        if (bVar9) {
          local_878->tfar = -INFINITY;
          return;
        }
      }
      goto LAB_006aac15;
    }
  }
  return;
LAB_006aad60:
  do {
    *local_880 = uVar12;
    local_880 = local_880 + 1;
    lVar4 = 0;
    if (uVar13 != 0) {
      for (; (uVar13 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
      }
    }
    uVar12 = *(ulong *)(uVar10 + lVar4 * 8);
    uVar13 = uVar13 - 1 & uVar13;
  } while (uVar13 != 0);
  goto LAB_006aac33;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }